

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::AnimatedLightNode::transform(AnimatedLightNode *this,AffineSpace3fa *space)

{
  pointer pRVar1;
  long lVar2;
  AnimatedLightNode *this_00;
  ulong uVar3;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  xfm_lights;
  Ref<embree::SceneGraph::LightNode> local_50;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  local_48;
  
  std::
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  ::vector(&local_48,*(long *)&space[1].p.field_0 - *(long *)((long)&space[1].l.vz.field_0 + 8) >> 3
           ,(allocator_type *)&local_50);
  lVar2 = *(long *)((long)&space[1].l.vz.field_0 + 8);
  if (*(long *)&space[1].p.field_0 != lVar2) {
    uVar3 = 0;
    do {
      (**(code **)(**(long **)(lVar2 + uVar3 * 8) + 0x80))(&local_50);
      pRVar1 = local_48.
               super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_48.
          super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar3].ptr != (LightNode *)0x0) {
        (*((local_48.
            super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar3].ptr)->super_Node).super_RefCount.
          _vptr_RefCount[3])();
      }
      pRVar1[uVar3].ptr = local_50.ptr;
      uVar3 = uVar3 + 1;
      lVar2 = *(long *)((long)&space[1].l.vz.field_0 + 8);
    } while (uVar3 < (ulong)(*(long *)&space[1].p.field_0 - lVar2 >> 3));
  }
  this_00 = (AnimatedLightNode *)operator_new(0x88);
  AnimatedLightNode(this_00,&local_48,*(BBox1f *)&space[2].l.vx.field_0);
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_LightNode).super_Node.super_RefCount._vptr_RefCount[2])(this_00);
  std::
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  ::~vector(&local_48);
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const
      {
        std::vector<Ref<LightNode>> xfm_lights(lights.size());
        for (size_t i=0; i<lights.size(); i++)
          xfm_lights[i] = lights[i]->transform(space);
        return new AnimatedLightNode(std::move(xfm_lights), time_range);
      }